

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  pointer *pppaVar1;
  aiAnimation *paVar2;
  aiScene *paVar3;
  pointer ppaVar4;
  aiAnimation *paVar5;
  long *plVar6;
  aiNodeAnim **ppaVar7;
  ulong uVar8;
  aiAnimation **__dest;
  long *plVar9;
  char *pcVar10;
  pointer ppaVar11;
  size_t sVar12;
  pointer __src;
  uint uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  unsigned_long *local_4a8;
  iterator iStack_4a0;
  unsigned_long *local_498;
  long *local_488;
  ulong local_480;
  long local_478 [2];
  long *local_468;
  ulong local_460;
  long local_458;
  long lStack_450;
  aiScene *local_448;
  long *local_440;
  string local_438 [32];
  
  local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppaVar11 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_448 = pScene;
  if (ppaVar11 == ppaVar4) {
    pcVar10 = (char *)0x0;
  }
  else {
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    do {
      paVar2 = ppaVar4[(long)paVar14];
      if (paVar2->mNumChannels == 1) {
        local_4a8 = (unsigned_long *)0x0;
        iStack_4a0._M_current = (unsigned_long *)0x0;
        local_498 = (unsigned_long *)0x0;
        local_438[0]._M_dataplus._M_p = (pointer)paVar14;
        while( true ) {
          local_438[0]._M_dataplus._M_p = local_438[0]._M_dataplus._M_p + 1;
          ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((undefined1 *)
              ((long)(this->mAnims).
                     super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppaVar4 >> 3) <=
              local_438[0]._M_dataplus._M_p) break;
          paVar5 = ppaVar4[(long)local_438[0]._M_dataplus._M_p];
          if (paVar5->mNumChannels == 1) {
            if ((paVar5->mDuration == paVar2->mDuration) &&
               (!NAN(paVar5->mDuration) && !NAN(paVar2->mDuration))) {
              if ((paVar5->mTicksPerSecond == paVar2->mTicksPerSecond) &&
                 (!NAN(paVar5->mTicksPerSecond) && !NAN(paVar2->mTicksPerSecond))) {
                if (iStack_4a0._M_current == local_498) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_4a8,
                             iStack_4a0,(unsigned_long *)local_438);
                }
                else {
                  *iStack_4a0._M_current = (unsigned_long)local_438[0]._M_dataplus._M_p;
                  iStack_4a0._M_current = iStack_4a0._M_current + 1;
                }
              }
            }
          }
        }
        if (local_4a8 != iStack_4a0._M_current) {
          paVar5 = (aiAnimation *)operator_new(0x448);
          (paVar5->mName).length = 0;
          (paVar5->mName).data[0] = '\0';
          memset((paVar5->mName).data + 1,0x1b,0x3ff);
          paVar5->mDuration = -1.0;
          paVar5->mTicksPerSecond = 0.0;
          paVar5->mNumChannels = 0;
          paVar5->mChannels = (aiNodeAnim **)0x0;
          paVar5->mNumMeshChannels = 0;
          paVar5->mMeshChannels = (aiMeshAnim **)0x0;
          paVar5->mNumMorphMeshChannels = 0;
          paVar5->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
          local_488 = local_478;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"combinedAnim_","");
          plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_488,local_480,0,'\x01');
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_458 = *plVar9;
            lStack_450 = plVar6[3];
            local_468 = &local_458;
          }
          else {
            local_458 = *plVar9;
            local_468 = (long *)*plVar6;
          }
          local_460 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_440 = local_468;
          sVar12 = local_460 & 0xffffffff;
          if ((local_460 & 0xfffffc00) != 0) {
            sVar12 = 0x3ff;
          }
          local_438[0]._M_dataplus._M_p._0_4_ = (ai_uint32)sVar12;
          memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),local_468,sVar12);
          *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar12 + 4) = 0;
          (paVar5->mName).length = (ai_uint32)sVar12;
          memcpy((paVar5->mName).data,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),sVar12);
          (paVar5->mName).data[sVar12] = '\0';
          if (local_440 != &local_458) {
            operator_delete(local_440,local_458 + 1);
          }
          if (local_488 != local_478) {
            operator_delete(local_488,local_478[0] + 1);
          }
          paVar5->mDuration = paVar2->mDuration;
          paVar5->mTicksPerSecond = paVar2->mTicksPerSecond;
          uVar13 = (int)((ulong)((long)iStack_4a0._M_current - (long)local_4a8) >> 3) + 1;
          paVar5->mNumChannels = uVar13;
          ppaVar7 = (aiNodeAnim **)operator_new__((ulong)uVar13 << 3);
          paVar5->mChannels = ppaVar7;
          *ppaVar7 = *paVar2->mChannels;
          *paVar2->mChannels = (aiNodeAnim *)0x0;
          if (paVar2 != (aiAnimation *)0x0) {
            aiAnimation::~aiAnimation(paVar2);
            operator_delete(paVar2,0x448);
          }
          (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
          super__Vector_impl_data._M_start[(long)paVar14] = paVar5;
          if (iStack_4a0._M_current != local_4a8) {
            uVar15 = 0;
            do {
              paVar2 = (this->mAnims).
                       super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                       super__Vector_impl_data._M_start[local_4a8[uVar15]];
              paVar5->mChannels[uVar15 + 1] = *paVar2->mChannels;
              *paVar2->mChannels = (aiNodeAnim *)0x0;
              if (paVar2 != (aiAnimation *)0x0) {
                aiAnimation::~aiAnimation(paVar2);
                operator_delete(paVar2,0x448);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < (ulong)((long)iStack_4a0._M_current - (long)local_4a8 >> 3));
          }
          if (local_4a8 != iStack_4a0._M_current) {
            do {
              ppaVar4 = (this->mAnims).
                        super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              ppaVar11 = (this->mAnims).
                         super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              __src = ppaVar4 + iStack_4a0._M_current[-1] + 1;
              if (__src != ppaVar11) {
                memmove(ppaVar4 + iStack_4a0._M_current[-1],__src,(long)ppaVar11 - (long)__src);
              }
              pppaVar1 = &(this->mAnims).
                          super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppaVar1 = *pppaVar1 + -1;
              iStack_4a0._M_current = iStack_4a0._M_current + -1;
            } while (local_4a8 != iStack_4a0._M_current);
          }
        }
        if (local_4a8 != (unsigned_long *)0x0) {
          operator_delete(local_4a8,(long)local_498 - (long)local_4a8);
        }
      }
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar14->_M_local_buf + 1);
      ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppaVar11 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pcVar10 = (char *)((long)ppaVar11 - (long)ppaVar4 >> 3);
    } while (paVar14 < pcVar10);
  }
  paVar3 = local_448;
  if (ppaVar4 != ppaVar11) {
    local_448->mNumAnimations = (uint)pcVar10;
    uVar8 = (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0xffffffffffffffff;
    if (-1 < (long)uVar8) {
      uVar15 = uVar8;
    }
    __dest = (aiAnimation **)operator_new__(uVar15);
    paVar3->mAnimations = __dest;
    ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar12 = (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar4;
    if (sVar12 != 0) {
      memmove(__dest,ppaVar4,sVar12);
    }
  }
  ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar4) {
    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar4;
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for( size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];
        if( templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
                    collectedAnimIndices.push_back(b);
            }

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}